

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::linearizationWarning(QPDF *this,string_view msg)

{
  pointer pMVar1;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  QPDF *local_20;
  QPDF *this_local;
  string_view msg_local;
  
  msg_local._M_len = (size_t)msg._M_str;
  this_local = (QPDF *)msg._M_len;
  local_20 = this;
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pMVar1->linearization_warnings = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_78,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_79);
  warn(this,qpdf_e_linearization,&local_40,0,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void
QPDF::linearizationWarning(std::string_view msg)
{
    m->linearization_warnings = true;
    warn(qpdf_e_linearization, "", 0, std::string(msg));
}